

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

FileInfo * __thiscall
cmBinUtilsMacOSMachOLinker::GetFileInfo(cmBinUtilsMacOSMachOLinker *this,string *file)

{
  bool bVar1;
  uint uVar2;
  pointer pcVar3;
  pointer ppVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_false,_true>,_bool>
  pVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>
  local_d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
  local_80;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_false,_true>,_bool>
  iter_inserted;
  undefined1 local_60 [8];
  FileInfo file_info;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
  local_28;
  iterator iter;
  string *file_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
               )file;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>_>_>
       ::find(&this->ScannedFileInfo,file);
  file_info.rpaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>_>_>
                ::end(&this->ScannedFileInfo);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
                      *)&file_info.rpaths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_false,_true>
                           *)&local_28);
    this_local = (cmBinUtilsMacOSMachOLinker *)&ppVar4->second;
  }
  else {
    FileInfo::FileInfo((FileInfo *)local_60);
    pcVar3 = std::
             unique_ptr<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>_>
             ::operator->(&this->Tool);
    uVar2 = (*pcVar3->_vptr_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool[2])
                      (pcVar3,iter.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
                              ._M_cur,(FileInfo *)local_60,
                       &file_info.libs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((uVar2 & 1) == 0) {
      this_local = (cmBinUtilsMacOSMachOLinker *)0x0;
    }
    else {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>
      ::pair<cmBinUtilsMacOSMachOLinker::FileInfo,_true>
                (&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 iter.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
                 ._M_cur,(FileInfo *)local_60);
      pVar5 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>_>_>
              ::insert(&this->ScannedFileInfo,&local_d0);
      local_80._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
           ._M_cur;
      iter_inserted.first.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_true>
      ._M_cur._0_1_ = pVar5.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>
      ::~pair(&local_d0);
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>,_false,_true>
                             *)&local_80);
      this_local = (cmBinUtilsMacOSMachOLinker *)&ppVar4->second;
    }
    iter_inserted.second = true;
    iter_inserted._9_3_ = 0;
    FileInfo::~FileInfo((FileInfo *)local_60);
  }
  return (FileInfo *)this_local;
}

Assistant:

auto cmBinUtilsMacOSMachOLinker::GetFileInfo(std::string const& file)
  -> const FileInfo*
{
  // Memoize processed rpaths and library dependencies to reduce the number
  // of calls to otool, especially in the case of heavily recursive libraries
  auto iter = ScannedFileInfo.find(file);
  if (iter != ScannedFileInfo.end()) {
    return &iter->second;
  }

  FileInfo file_info;
  if (!this->Tool->GetFileInfo(file, file_info.libs, file_info.rpaths)) {
    // Call to otool failed
    return nullptr;
  }

  auto iter_inserted = ScannedFileInfo.insert({ file, std::move(file_info) });
  return &iter_inserted.first->second;
}